

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O0

DSA * DSAparams_dup(DSA *x)

{
  BIGNUM *pBVar1;
  DSA *ret;
  DSA *dsa_local;
  
  dsa_local = (DSA *)DSA_new();
  if ((DSA *)dsa_local == (DSA *)0x0) {
    dsa_local = (DSA *)0x0;
  }
  else {
    pBVar1 = BN_dup(*(BIGNUM **)x);
    *(BIGNUM **)dsa_local = pBVar1;
    pBVar1 = BN_dup((BIGNUM *)x->version);
    ((DSA *)dsa_local)->version = (long)pBVar1;
    pBVar1 = BN_dup(*(BIGNUM **)&x->write_params);
    *(BIGNUM **)&((DSA *)dsa_local)->write_params = pBVar1;
    if (((*(long *)dsa_local == 0) || (((DSA *)dsa_local)->version == 0)) ||
       (*(long *)&((DSA *)dsa_local)->write_params == 0)) {
      DSA_free((DSA *)dsa_local);
      dsa_local = (DSA *)0x0;
    }
  }
  return (DSA *)dsa_local;
}

Assistant:

DSA *DSAparams_dup(const DSA *dsa) {
  DSA *ret = DSA_new();
  if (ret == NULL) {
    return NULL;
  }
  ret->p = BN_dup(dsa->p);
  ret->q = BN_dup(dsa->q);
  ret->g = BN_dup(dsa->g);
  if (ret->p == NULL || ret->q == NULL || ret->g == NULL) {
    DSA_free(ret);
    return NULL;
  }
  return ret;
}